

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O3

void __thiscall icu_63::RuleBasedCollator::~RuleBasedCollator(RuleBasedCollator *this)

{
  (this->super_Collator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedCollator_003af770;
  if (this->settings != (CollationSettings *)0x0) {
    SharedObject::removeRef(&this->settings->super_SharedObject);
    this->settings = (CollationSettings *)0x0;
  }
  if (this->cacheEntry != (CollationCacheEntry *)0x0) {
    SharedObject::removeRef(&this->cacheEntry->super_SharedObject);
    this->cacheEntry = (CollationCacheEntry *)0x0;
  }
  Locale::~Locale(&this->validLocale);
  Collator::~Collator(&this->super_Collator);
  return;
}

Assistant:

RuleBasedCollator::~RuleBasedCollator() {
    SharedObject::clearPtr(settings);
    SharedObject::clearPtr(cacheEntry);
}